

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.hpp
# Opt level: O2

void boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::construct
               (PyObject *obj,rvalue_from_python_stage1_data *data)

{
  undefined4 uVar1;
  
  uVar1 = PyLong_AsLong();
  *(undefined4 *)&data[1].convertible = uVar1;
  data->convertible = data + 1;
  return;
}

Assistant:

void enum_<T>::construct(PyObject* obj, converter::rvalue_from_python_stage1_data* data)
{
#if PY_VERSION_HEX >= 0x03000000
    T x = static_cast<T>(PyLong_AS_LONG(obj));
#else
    T x = static_cast<T>(PyInt_AS_LONG(obj));
#endif
    void* const storage = ((converter::rvalue_from_python_storage<T>*)data)->storage.bytes;
    new (storage) T(x);
    data->convertible = storage;
}